

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_power_word_fear(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *txt;
  AFFECT_DATA af;
  
  if ((CHAR_DATA *)vo == ch) {
    txt = "That wouldn\'t work.\n\r";
  }
  else {
    act("$n points at $N and utters the word \'Fear!\'",ch,(void *)0x0,vo,1);
    act("$n points at you and utters the word \'Fear!\'",ch,(void *)0x0,vo,2);
    act("You point at $N and utter the word \'Fear!\'",ch,(void *)0x0,vo,3);
    bVar1 = is_awake((CHAR_DATA *)vo);
    if (bVar1) {
      bVar1 = is_affected((CHAR_DATA *)vo,sn);
      if (bVar1) {
        send_to_char("They are already affected by a word of power.\n\r",ch);
        txt = "You feel a shiver pass through you but it has no further affect.\n\r";
        ch = (CHAR_DATA *)vo;
      }
      else {
        bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
        if (!bVar1) {
          bVar1 = saves_spell(level + -2,(CHAR_DATA *)vo,0x10);
          if ((!bVar1) && (bVar2 = saves_spell(level + -5,(CHAR_DATA *)vo,0x10), !bVar2)) {
            act("$n\'s eyes widen and $s heart ruptures from shock!",(CHAR_DATA *)vo,(void *)0x0,
                (void *)0x0,0);
            send_to_char("You feel a terror so intense your heart stops dead!\n\r",(CHAR_DATA *)vo);
            raw_kill(ch,(CHAR_DATA *)vo);
            return;
          }
          act("$n\'s eyes widen in shock and $s entire body freezes in momentary terror.",
              (CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
          send_to_char("You feel an overwhelming terror and you shudder in momentary shock.\n\r",
                       (CHAR_DATA *)vo);
          init_affect(&af);
          af.where = 0;
          af.aftype = 0;
          af.type = (short)sn;
          af.level = (short)level;
          iVar3 = number_range(1,5);
          af.duration = (short)iVar3 + (short)((long)level / 10);
          af.location = 5;
          iVar3 = (int)((long)level / 10);
          iVar4 = number_range(2,iVar3 + 1);
          af.modifier = -(short)iVar4;
          affect_to_char((CHAR_DATA *)vo,&af);
          af.location = 1;
          iVar4 = number_range(2,iVar3 + 1);
          af.modifier = -(short)iVar4;
          affect_to_char((CHAR_DATA *)vo,&af);
          af.location = 2;
          iVar4 = number_range(1,iVar3);
          af.modifier = -(short)iVar4;
          affect_to_char((CHAR_DATA *)vo,&af);
          af.location = 0xd;
          iVar4 = number_range(2,iVar3);
          af.modifier = -(short)iVar4;
          affect_to_char((CHAR_DATA *)vo,&af);
          af.location = 0x13;
          iVar3 = number_range(2,iVar3);
          af.modifier = -(short)iVar3;
          affect_to_char((CHAR_DATA *)vo,&af);
          if (((*(short *)((long)vo + 0x1f8) == 7) &&
              (do_flee((CHAR_DATA *)vo,""), *(short *)((long)vo + 0x1f8) == 7)) &&
             (do_flee((CHAR_DATA *)vo,""), *(short *)((long)vo + 0x1f8) == 7)) {
            do_flee((CHAR_DATA *)vo,"");
          }
          if (!bVar1) {
            LAG_CHAR((CHAR_DATA *)vo,0xc);
          }
          return;
        }
        act("$n shivers momentarily but it passes.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        txt = "You feel a brief terror, but it passes.\n\r";
        ch = (CHAR_DATA *)vo;
      }
    }
    else {
      act("$n shivers momentarily but it passes.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      txt = "You feel a brief terror, but it passes away in your dreams.\n\r";
      ch = (CHAR_DATA *)vo;
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_power_word_fear(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	bool bad_fail, utter_fail;
	int range;

	bad_fail = false;
	utter_fail = false;

	if (victim == ch)
	{
		send_to_char("That wouldn't work.\n\r", ch);
		return;
	}

	act("$n points at $N and utters the word 'Fear!'", ch, 0, victim, TO_NOTVICT);
	act("$n points at you and utters the word 'Fear!'", ch, 0, victim, TO_VICT);
	act("You point at $N and utter the word 'Fear!'", ch, 0, victim, TO_CHAR);

	if (!is_awake(victim))
	{
		act("$n shivers momentarily but it passes.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a brief terror, but it passes away in your dreams.\n\r", victim);
		return;
	}

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by a word of power.\n\r", ch);
		send_to_char("You feel a shiver pass through you but it has no further affect.\n\r", victim);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER))
	{
		act("$n shivers momentarily but it passes.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a brief terror, but it passes.\n\r", victim);
		return;
	}

	if (!saves_spell(level - 2, victim, DAM_OTHER))
	{
		bad_fail = true;

		if (!saves_spell(level - 5, victim, DAM_OTHER))
			utter_fail = true;
	}

	if (utter_fail)
	{
		act("$n's eyes widen and $s heart ruptures from shock!", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a terror so intense your heart stops dead!\n\r", victim);
		raw_kill(ch, victim);
		return;
	}

	act("$n's eyes widen in shock and $s entire body freezes in momentary terror.", victim, nullptr, nullptr, TO_ROOM);
	send_to_char("You feel an overwhelming terror and you shudder in momentary shock.\n\r", victim);

	range = level / 10;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = (number_range(1, 5) + range);
	af.location = APPLY_CON;
	af.modifier = -number_range(2, range + 1);
	affect_to_char(victim, &af);

	af.location = APPLY_STR;
	af.modifier = -number_range(2, range + 1);
	affect_to_char(victim, &af);

	af.location = APPLY_DEX;
	af.modifier = -number_range(1, range);
	affect_to_char(victim, &af);

	af.location = APPLY_HIT;
	af.modifier = -number_range(2, range);
	affect_to_char(victim, &af);

	af.location = APPLY_DAMROLL;
	af.modifier = -number_range(2, range);
	affect_to_char(victim, &af);

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (victim->position == POS_FIGHTING)
		do_flee(victim, "");

	if (bad_fail)
		LAG_CHAR(victim, 12);
}